

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWriteTruth(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Ntk_t *pNtk_00;
  Hop_Man_t *p;
  Hop_Obj_t *pRoot;
  bool bVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Vec_Int_t *vTruth_00;
  uint *Sign;
  FILE *__stream;
  char *pcVar4;
  uint local_60;
  int c;
  int fReverse;
  int fHex;
  uint *pTruth;
  FILE *pFile;
  char *pFileName;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk;
  Vec_Int_t *vTruth;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = pAbc->pNtkCur;
  bVar1 = true;
  local_60 = 0;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"xrh"), iVar2 != -1) {
    if (iVar2 == 0x68) goto LAB_00acaa25;
    if (iVar2 == 0x72) {
      local_60 = local_60 ^ 1;
    }
    else {
      if (iVar2 != 0x78) goto LAB_00acaa25;
      bVar1 = (bool)(bVar1 ^ 1);
    }
  }
  if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
    printf("Current network is not available.\n");
    pAbc_local._4_4_ = 0;
  }
  else {
    iVar2 = Abc_NtkIsLogic(pNtk_00);
    if (iVar2 == 0) {
      printf("Current network should not an AIG. Run \"logic\".\n");
      pAbc_local._4_4_ = 0;
    }
    else {
      iVar2 = Abc_NtkPoNum(pNtk_00);
      if (iVar2 == 1) {
        iVar2 = Abc_NtkNodeNum(pNtk_00);
        if (iVar2 == 1) {
          pAVar3 = Abc_NtkPo(pNtk_00,0);
          pAVar3 = Abc_ObjFanin0(pAVar3);
          iVar2 = Abc_ObjFaninNum(pAVar3);
          if (iVar2 == 0) {
            printf("Can only write logic function with 0 inputs.\n");
            pAbc_local._4_4_ = 0;
          }
          else {
            iVar2 = Abc_ObjFaninNum(pAVar3);
            if (iVar2 < 0x11) {
              if (argc == globalUtilOptind + 1) {
                pcVar4 = argv[globalUtilOptind];
                Abc_NtkToAig(pNtk_00);
                vTruth_00 = Vec_IntAlloc(0);
                p = (Hop_Man_t *)pNtk_00->pManFunc;
                pRoot = (Hop_Obj_t *)(pAVar3->field_5).pData;
                iVar2 = Abc_ObjFaninNum(pAVar3);
                Sign = Hop_ManConvertAigToTruth(p,pRoot,iVar2,vTruth_00,local_60);
                __stream = fopen(pcVar4,"w");
                if (__stream == (FILE *)0x0) {
                  Vec_IntFree(vTruth_00);
                  printf("Cannot open file \"%s\" for writing.\n",pcVar4);
                  pAbc_local._4_4_ = 0;
                }
                else {
                  if (bVar1) {
                    iVar2 = Abc_ObjFaninNum(pAVar3);
                    Extra_PrintHex2((FILE *)__stream,Sign,iVar2);
                  }
                  else {
                    iVar2 = Abc_ObjFaninNum(pAVar3);
                    Extra_PrintBinary((FILE *)__stream,Sign,1 << ((byte)iVar2 & 0x1f));
                  }
                  fclose(__stream);
                  Vec_IntFree(vTruth_00);
                  pAbc_local._4_4_ = 0;
                }
              }
              else {
LAB_00acaa25:
                fprintf((FILE *)pAbc->Err,"usage: write_truth [-xrh] <file>\n");
                fprintf((FILE *)pAbc->Err,"\t         writes truth table into a file\n");
                pcVar4 = "bin";
                if (bVar1) {
                  pcVar4 = "hex";
                }
                fprintf((FILE *)pAbc->Err,
                        "\t-x     : toggles between bin and hex representation [default = %s]\n",
                        pcVar4);
                pcVar4 = "no";
                if (local_60 != 0) {
                  pcVar4 = "yes";
                }
                fprintf((FILE *)pAbc->Err,
                        "\t-r     : toggle reversing bits in the truth table [default = %s]\n",
                        pcVar4);
                fprintf((FILE *)pAbc->Err,"\t-h     : print the help massage\n");
                fprintf((FILE *)pAbc->Err,"\tfile   : the name of the file to write\n");
                pAbc_local._4_4_ = 1;
              }
            }
            else {
              printf("Can only write logic function with no more than 16 inputs.\n");
              pAbc_local._4_4_ = 0;
            }
          }
        }
        else {
          printf("Current network should have exactly one node.\n");
          pAbc_local._4_4_ = 0;
        }
      }
      else {
        printf("Current network should have exactly one primary output.\n");
        pAbc_local._4_4_ = 0;
      }
    }
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandWriteTruth( Abc_Frame_t * pAbc, int argc, char **argv )
{
    Vec_Int_t * vTruth;
    Abc_Ntk_t * pNtk = pAbc->pNtkCur;
    Abc_Obj_t * pNode;
    char * pFileName;
    FILE * pFile;
    unsigned * pTruth;
    int fHex = 1;
    int fReverse = 0;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "xrh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'x':
                fHex ^= 1;
                break;
            case 'r':
                fReverse ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        printf( "Current network is not available.\n" );
        return 0;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        printf( "Current network should not an AIG. Run \"logic\".\n" );
        return 0;
    }
    if ( Abc_NtkPoNum(pNtk) != 1 )
    {
        printf( "Current network should have exactly one primary output.\n" );
        return 0;
    }
    if ( Abc_NtkNodeNum(pNtk) != 1 )
    {
        printf( "Current network should have exactly one node.\n" );
        return 0;
    }
    pNode = Abc_ObjFanin0( Abc_NtkPo(pNtk, 0) );
    if ( Abc_ObjFaninNum(pNode) == 0 )
    { 
        printf( "Can only write logic function with 0 inputs.\n" );
        return 0;
    }
    if ( Abc_ObjFaninNum(pNode) > 16 )
    { 
        printf( "Can only write logic function with no more than 16 inputs.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // convert to logic
    Abc_NtkToAig( pNtk );
    vTruth = Vec_IntAlloc( 0 );
    pTruth = Hop_ManConvertAigToTruth( (Hop_Man_t *)pNtk->pManFunc, (Hop_Obj_t *)pNode->pData, Abc_ObjFaninNum(pNode), vTruth, fReverse );
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        Vec_IntFree( vTruth );
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return 0;
    }
    if ( fHex )
        Extra_PrintHex2( pFile, pTruth, Abc_ObjFaninNum(pNode) );
    else
        Extra_PrintBinary( pFile, pTruth, 1<<Abc_ObjFaninNum(pNode) );
    fclose( pFile );
    Vec_IntFree( vTruth );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_truth [-xrh] <file>\n" );
    fprintf( pAbc->Err, "\t         writes truth table into a file\n" );
    fprintf( pAbc->Err, "\t-x     : toggles between bin and hex representation [default = %s]\n", fHex?  "hex":"bin" );
    fprintf( pAbc->Err, "\t-r     : toggle reversing bits in the truth table [default = %s]\n", fReverse? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}